

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O0

bool __thiscall GGWave::prepare(GGWave *this,Parameters *parameters,bool allocate)

{
  float fVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  void *pvVar6;
  int *piVar7;
  RxProtocols *__src;
  TxProtocols *__src_00;
  byte in_DL;
  int *in_RSI;
  GGWave *in_RDI;
  int heapSize0;
  int *in_stack_00000078;
  void *in_stack_00000080;
  GGWave *in_stack_00000088;
  SampleFormat in_stack_ffffffffffffffc0;
  bool local_39;
  GGWave *this_00;
  ushort uStack_22;
  bool local_1;
  
  if (in_RDI->m_heap != (void *)0x0) {
    free(in_RDI->m_heap);
    in_RDI->m_heap = (void *)0x0;
    in_RDI->m_heapSize = 0;
  }
  *(int *)&((Protocol *)&in_RDI->m_sampleRateInp)->name = in_RSI[1];
  in_RDI->m_sampleRateOut = (float)in_RSI[2];
  in_RDI->m_sampleRate = (float)in_RSI[3];
  in_RDI->m_samplesPerFrame = in_RSI[4];
  in_RDI->m_isamplesPerFrame = 1.0 / (float)in_RDI->m_samplesPerFrame;
  iVar5 = anon_unknown.dwarf_1d8e::bytesForSampleFormat(in_stack_ffffffffffffffc0);
  in_RDI->m_sampleSizeInp = iVar5;
  iVar5 = anon_unknown.dwarf_1d8e::bytesForSampleFormat(in_stack_ffffffffffffffc0);
  in_RDI->m_sampleSizeOut = iVar5;
  in_RDI->m_sampleFormatInp = in_RSI[6];
  in_RDI->m_sampleFormatOut = in_RSI[7];
  in_RDI->m_hzPerSample = in_RDI->m_sampleRate / (float)in_RDI->m_samplesPerFrame;
  in_RDI->m_ihzPerSample = 1.0 / in_RDI->m_hzPerSample;
  in_RDI->m_freqDelta_bin = 1;
  in_RDI->m_freqDelta_hz = in_RDI->m_hzPerSample * 2.0;
  in_RDI->m_nBitsInMarker = 0x10;
  iVar5 = 0x10;
  if (0 < *in_RSI) {
    iVar5 = 0;
  }
  in_RDI->m_nMarkerFrames = iVar5;
  iVar5 = 3;
  if (0 < *in_RSI) {
    iVar5 = 0;
  }
  in_RDI->m_encodedDataOffset = iVar5;
  in_RDI->m_soundMarkerThreshold = (float)in_RSI[5];
  in_RDI->m_isFixedPayloadLength = 0 < *in_RSI;
  in_RDI->m_payloadLength = *in_RSI;
  in_RDI->m_isRxEnabled = (in_RSI[8] & 2U) != 0;
  in_RDI->m_isTxEnabled = (in_RSI[8] & 4U) != 0;
  fVar1 = *(float *)&((Protocol *)&in_RDI->m_sampleRateInp)->name;
  local_39 = true;
  if ((fVar1 == in_RDI->m_sampleRate) && (!NAN(fVar1) && !NAN(in_RDI->m_sampleRate))) {
    local_39 = in_RDI->m_sampleRateOut != in_RDI->m_sampleRate;
  }
  in_RDI->m_needResampling = local_39;
  in_RDI->m_txOnlyTones = (in_RSI[8] & 8U) != 0;
  in_RDI->m_isDSSEnabled = (in_RSI[8] & 0x10U) != 0;
  if (in_RDI->m_sampleSizeInp == 0) {
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      fprintf((anonymous_namespace)::g_fptr,"Invalid or unsupported capture sample format: %d\n",
              (ulong)(uint)in_RSI[6]);
    }
    local_1 = false;
  }
  else if (in_RDI->m_sampleSizeOut == 0) {
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      fprintf((anonymous_namespace)::g_fptr,"Invalid or unsupported playback sample format: %d\n",
              (ulong)(uint)in_RSI[7]);
    }
    local_1 = false;
  }
  else if (in_RSI[4] < 0x401) {
    if (1000.0 < *(float *)&((Protocol *)&in_RDI->m_sampleRateInp)->name ||
        *(float *)&((Protocol *)&in_RDI->m_sampleRateInp)->name == 1000.0) {
      if (*(float *)&((Protocol *)&in_RDI->m_sampleRateInp)->name <= 96000.0) {
        in_RDI->m_heap = (void *)0x0;
        in_RDI->m_heapSize = 0;
        bVar4 = alloc(in_stack_00000088,in_stack_00000080,in_stack_00000078);
        if (bVar4) {
          if ((in_DL & 1) == 0) {
            local_1 = true;
          }
          else {
            uVar2 = in_RDI->m_heapSize;
            pvVar6 = calloc((long)in_RDI->m_heapSize,1);
            in_RDI->m_heap = pvVar6;
            in_RDI->m_heapSize = 0;
            bVar4 = alloc(in_stack_00000088,in_stack_00000080,in_stack_00000078);
            if (bVar4) {
              if (uVar2 == in_RDI->m_heapSize) {
                if ((in_RDI->m_isRxEnabled & 1U) != 0) {
                  (in_RDI->m_rx).samplesNeeded = in_RDI->m_samplesPerFrame;
                  piVar7 = ggvector<int>::operator[](&(in_RDI->m_rx).fftWorkI,0);
                  *piVar7 = 0;
                  this_00 = (GGWave *)0x0;
                  (in_RDI->m_rx).protocol.name = (char *)0x0;
                  lVar3 = (ulong)uStack_22 << 0x30;
                  (in_RDI->m_rx).protocol.freqStart = (short)lVar3;
                  (in_RDI->m_rx).protocol.framesPerTx = (char)((ulong)lVar3 >> 0x10);
                  (in_RDI->m_rx).protocol.bytesPerTx = (char)((ulong)lVar3 >> 0x18);
                  (in_RDI->m_rx).protocol.extra = (char)((ulong)lVar3 >> 0x20);
                  (in_RDI->m_rx).protocol.enabled = (bool)(char)((ulong)lVar3 >> 0x28);
                  *(short *)&(in_RDI->m_rx).protocol.field_0xe = (short)((ulong)lVar3 >> 0x30);
                  (in_RDI->m_rx).protocolId = GGWAVE_PROTOCOL_COUNT;
                  __src = Protocols::rx();
                  memcpy(&(in_RDI->m_rx).protocols,__src,0x160);
                  iVar5 = minFreqStart(this_00,(Protocols *)in_RDI);
                  (in_RDI->m_rx).minFreqStart = iVar5;
                }
                if ((in_RDI->m_isTxEnabled & 1U) != 0) {
                  __src_00 = Protocols::tx();
                  memcpy(&(in_RDI->m_tx).protocols,__src_00,0x160);
                }
                iVar5 = init(in_RDI,(EVP_PKEY_CTX *)0x117a57);
                local_1 = (bool)((byte)iVar5 & 1);
              }
              else {
                if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
                  fprintf((anonymous_namespace)::g_fptr,
                          "Error: failed to allocate memory - heapSize0: %d, heapSize: %d\n",
                          (ulong)uVar2,(ulong)(uint)in_RDI->m_heapSize);
                }
                local_1 = false;
              }
            }
            else {
              if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
                fprintf((anonymous_namespace)::g_fptr,
                        "Error: failed to allocate the required memory: %d\n",
                        (ulong)(uint)in_RDI->m_heapSize);
              }
              local_1 = false;
            }
          }
        }
        else {
          if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
            fprintf((anonymous_namespace)::g_fptr,
                    "Error: failed to compute the size of the required memory\n");
          }
          local_1 = false;
        }
      }
      else {
        if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
          fprintf((anonymous_namespace)::g_fptr,
                  "Error: capture sample rate (%g Hz) must be <= %g Hz\n",
                  (double)*(float *)&((Protocol *)&in_RDI->m_sampleRateInp)->name,0x40f7700000000000
                 );
        }
        local_1 = false;
      }
    }
    else {
      if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
        fprintf((anonymous_namespace)::g_fptr,
                "Error: capture sample rate (%g Hz) must be >= %g Hz\n",
                (double)*(float *)&((Protocol *)&in_RDI->m_sampleRateInp)->name,0x408f400000000000);
      }
      local_1 = false;
    }
  }
  else {
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      fprintf((anonymous_namespace)::g_fptr,"Invalid samples per frame: %d, max: %d\n",
              (ulong)(uint)in_RSI[4],0x400);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool GGWave::prepare(const Parameters & parameters, bool allocate) {
    if (m_heap) {
        free(m_heap);
        m_heap = nullptr;
        m_heapSize = 0;
    }

    // parameter initialization:

    m_sampleRateInp        = parameters.sampleRateInp;
    m_sampleRateOut        = parameters.sampleRateOut;
    m_sampleRate           = parameters.sampleRate;
    m_samplesPerFrame      = parameters.samplesPerFrame;
    m_isamplesPerFrame     = 1.0f/m_samplesPerFrame;
    m_sampleSizeInp        = bytesForSampleFormat(parameters.sampleFormatInp);
    m_sampleSizeOut        = bytesForSampleFormat(parameters.sampleFormatOut);
    m_sampleFormatInp      = parameters.sampleFormatInp;
    m_sampleFormatOut      = parameters.sampleFormatOut;
    m_hzPerSample          = m_sampleRate/m_samplesPerFrame;
    m_ihzPerSample         = 1.0f/m_hzPerSample;
    m_freqDelta_bin        = 1;
    m_freqDelta_hz         = 2*m_hzPerSample;
    m_nBitsInMarker        = 16;
    m_nMarkerFrames        = parameters.payloadLength > 0 ? 0 : kDefaultMarkerFrames;
    m_encodedDataOffset    = parameters.payloadLength > 0 ? 0 : kDefaultEncodedDataOffset;
    m_soundMarkerThreshold = parameters.soundMarkerThreshold;
    m_isFixedPayloadLength = parameters.payloadLength > 0;
    m_payloadLength        = parameters.payloadLength;
    m_isRxEnabled          = parameters.operatingMode & GGWAVE_OPERATING_MODE_RX;
    m_isTxEnabled          = parameters.operatingMode & GGWAVE_OPERATING_MODE_TX;
    m_needResampling       = m_sampleRateInp != m_sampleRate || m_sampleRateOut != m_sampleRate;
    m_txOnlyTones          = parameters.operatingMode & GGWAVE_OPERATING_MODE_TX_ONLY_TONES;
    m_isDSSEnabled         = parameters.operatingMode & GGWAVE_OPERATING_MODE_USE_DSS;

    if (m_sampleSizeInp == 0) {
        ggprintf("Invalid or unsupported capture sample format: %d\n", (int) parameters.sampleFormatInp);
        return false;
    }

    if (m_sampleSizeOut == 0) {
        ggprintf("Invalid or unsupported playback sample format: %d\n", (int) parameters.sampleFormatOut);
        return false;
    }

    if (parameters.samplesPerFrame > kMaxSamplesPerFrame) {
        ggprintf("Invalid samples per frame: %d, max: %d\n", parameters.samplesPerFrame, kMaxSamplesPerFrame);
        return false;
    }

    if (m_sampleRateInp < kSampleRateMin) {
        ggprintf("Error: capture sample rate (%g Hz) must be >= %g Hz\n", m_sampleRateInp, kSampleRateMin);
        return false;
    }

    if (m_sampleRateInp > kSampleRateMax) {
        ggprintf("Error: capture sample rate (%g Hz) must be <= %g Hz\n", m_sampleRateInp, kSampleRateMax);
        return false;
    }

    // memory allocation:

    m_heap = nullptr;
    m_heapSize = 0;

    if (this->alloc(m_heap, m_heapSize) == false) {
        ggprintf("Error: failed to compute the size of the required memory\n");
        return false;
    }

    if (allocate == false) {
        return true;
    }

    const auto heapSize0 = m_heapSize;

    m_heap = calloc(m_heapSize, 1);

    m_heapSize = 0;
    if (this->alloc(m_heap, m_heapSize) == false) {
        ggprintf("Error: failed to allocate the required memory: %d\n", m_heapSize);
        return false;
    }

    if (heapSize0 != m_heapSize) {
        ggprintf("Error: failed to allocate memory - heapSize0: %d, heapSize: %d\n", heapSize0, m_heapSize);
        return false;
    }

    if (m_isRxEnabled) {
        m_rx.samplesNeeded = m_samplesPerFrame;

        m_rx.fftWorkI[0] = 0;

        m_rx.protocol   = {};
        m_rx.protocolId = GGWAVE_PROTOCOL_COUNT;
        m_rx.protocols  = Protocols::rx();

        m_rx.minFreqStart = minFreqStart(m_rx.protocols);
    }

    if (m_isTxEnabled) {
        m_tx.protocols = Protocols::tx();
    }

    return init("", {}, 0);
}